

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O2

int AF_A_SorcSpinBalls(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *pAVar3;
  AActor *this_00;
  char *__assertion;
  FName local_44;
  FName local_40;
  FName local_3c;
  DVector3 local_38;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053be0c;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0053bc77:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)this_00,AHeresiarch::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AHeresiarch))";
          goto LAB_0053be0c;
        }
      }
      if (numparam == 1) goto LAB_0053bcf7;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053bdfc;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053be0c;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053bdfc;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053bcf7:
        this_00->SpawnState = this_00->SpawnState + 2;
        this_00->args[2] = 7;
        this_00->args[0] = 0;
        this_00->args[3] = 5;
        this_00->args[4] = 7;
        this_00[1].super_DThinker.super_DObject.Class = (PClass *)0x3ff0000000000000;
        local_38.Z = (this_00->Height - this_00->Floorclip) + (this_00->__Pos).Z;
        local_38.X = (this_00->__Pos).X;
        local_38.Y = (this_00->__Pos).Y;
        FName::FName(&local_3c,"SorcBall1");
        pAVar3 = Spawn(&local_3c,&local_38,NO_REPLACE);
        if (pAVar3 != (AActor *)0x0) {
          (pAVar3->target).field_0.p = this_00;
          pAVar3->special2 = 0x12;
        }
        FName::FName(&local_40,"SorcBall2");
        pAVar3 = Spawn(&local_40,&local_38,NO_REPLACE);
        if (pAVar3 != (AActor *)0x0) {
          (pAVar3->target).field_0.p = this_00;
        }
        FName::FName(&local_44,"SorcBall3");
        pAVar3 = Spawn(&local_44,&local_38,NO_REPLACE);
        if (pAVar3 != (AActor *)0x0) {
          (pAVar3->target).field_0.p = this_00;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053be0c;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0053bc77;
  }
LAB_0053bdfc:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053be0c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0xd8,"int AF_A_SorcSpinBalls(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SorcSpinBalls)
{
	PARAM_ACTION_PROLOGUE_TYPE(AHeresiarch);

	AActor *mo;

	self->SpawnState += 2;		// [RH] Don't spawn balls again
	A_SlowBalls(self);
	self->args[0] = 0;								// Currently no defense
	self->args[3] = SORC_NORMAL;
	self->args[4] = SORCBALL_INITIAL_SPEED;		// Initial orbit speed
	self->BallAngle = 1.;

	DVector3 pos = self->PosPlusZ(-self->Floorclip + self->Height);
	
	mo = Spawn("SorcBall1", pos, NO_REPLACE);
	if (mo)
	{
		mo->target = self;
		mo->special2 = SORCFX4_RAPIDFIRE_TIME;
	}
	mo = Spawn("SorcBall2", pos, NO_REPLACE);
	if (mo) mo->target = self;
	mo = Spawn("SorcBall3", pos, NO_REPLACE);
	if (mo) mo->target = self;
	return 0;
}